

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Matchers::Impl::MatcherUntypedBase::~MatcherUntypedBase(MatcherUntypedBase *this)

{
  this->_vptr_MatcherUntypedBase = (_func_int **)&PTR__MatcherUntypedBase_00196c10;
  std::__cxx11::string::~string((string *)&this->m_cachedToString);
  return;
}

Assistant:

MatcherUntypedBase::~MatcherUntypedBase() = default;